

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsd_mbe.cpp
# Opt level: O3

void __thiscall DSDcc::DSDMBEDecoder::processAudio(DSDMBEDecoder *this)

{
  char *pcVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  bool bVar4;
  byte bVar5;
  int iVar6;
  undefined1 auVar7 [12];
  float fVar8;
  int iVar9;
  long lVar10;
  float *pfVar11;
  short *psVar12;
  long lVar13;
  short sVar14;
  short sVar15;
  int iVar16;
  float *pfVar17;
  undefined1 auVar18 [16];
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  float fVar23;
  
  if (this->m_auto_gain == true) {
    this->m_audio_out_temp_buf_p = this->m_audio_out_temp_buf;
    auVar18 = ZEXT816(0);
    lVar10 = 0x3a;
    do {
      pcVar1 = this->imbe_d + lVar10 * 4 + -8;
      auVar20._0_8_ = *(ulong *)pcVar1 & 0x7fffffff7fffffff;
      auVar20._8_4_ = *(uint *)(pcVar1 + 8) & 0x7fffffff;
      auVar20._12_4_ = *(uint *)(pcVar1 + 0xc) & 0x7fffffff;
      auVar18 = maxps(auVar18,auVar20);
      lVar10 = lVar10 + 4;
    } while (lVar10 != 0xda);
    auVar7._4_8_ = auVar20._8_8_;
    auVar7._0_4_ = auVar18._4_4_;
    auVar21._0_8_ = auVar7._0_8_ << 0x20;
    auVar21._8_4_ = auVar18._8_4_;
    auVar21._12_4_ = auVar18._12_4_;
    auVar22._8_8_ = auVar18._8_8_;
    auVar22._0_8_ = auVar21._8_8_;
    auVar18 = maxps(auVar22,auVar18);
    fVar19 = auVar18._4_4_;
    if (auVar18._4_4_ <= auVar18._0_4_) {
      fVar19 = auVar18._0_4_;
    }
    pfVar11 = this->m_aout_max_buf_p;
    *pfVar11 = fVar19;
    this->m_aout_max_buf_p = pfVar11 + 1;
    iVar9 = this->m_aout_max_buf_idx;
    this->m_aout_max_buf_idx = iVar9 + 1;
    if (0x17 < iVar9) {
      this->m_aout_max_buf_idx = 0;
      this->m_aout_max_buf_p = this->m_aout_max_buf;
    }
    lVar10 = 0;
    do {
      if (fVar19 <= this->m_aout_max_buf[lVar10]) {
        fVar19 = this->m_aout_max_buf[lVar10];
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0x19);
    fVar23 = (float)(~-(uint)(0.0 < fVar19) & 0x42480000 |
                    (uint)(30000.0 / fVar19) & -(uint)(0.0 < fVar19));
    fVar19 = this->m_aout_gain;
    if (fVar19 <= fVar23) {
      fVar8 = 50.0;
      if (fVar23 <= 50.0) {
        fVar8 = fVar23;
      }
      fVar23 = fVar8 - fVar19;
      if (fVar19 * 0.05 < fVar8 - fVar19) {
        fVar23 = fVar19 * 0.05;
      }
    }
    else {
      this->m_aout_gain = fVar23;
      fVar23 = 0.0;
    }
    lVar10 = 0;
    do {
      this->m_audio_out_temp_buf[lVar10] =
           ((float)(int)lVar10 * fVar23 * 0.00625 + this->m_aout_gain) *
           this->m_audio_out_temp_buf[lVar10];
      lVar10 = lVar10 + 1;
    } while ((int)lVar10 != 0xa0);
    this->m_aout_gain = fVar23 + this->m_aout_gain;
  }
  pfVar11 = this->m_audio_out_temp_buf;
  this->m_audio_out_temp_buf_p = pfVar11;
  iVar9 = this->m_upsample;
  if ((long)iVar9 < 2) {
    iVar9 = this->m_audio_out_nb_samples + 0xa0;
    if (iVar9 < this->m_audio_out_buf_size) {
      psVar12 = this->m_audio_out_buf_p;
    }
    else {
      psVar12 = this->m_audio_out_buf;
      iVar9 = 0xa0;
    }
    this->m_audio_out_float_buf_p = this->m_audio_out_float_buf;
    bVar4 = this->m_stereo;
    iVar6 = this->m_audio_out_idx;
    iVar16 = this->m_audio_out_idx2;
    lVar10 = 0xe8;
    do {
      lVar13 = lVar10;
      fVar19 = *(float *)(this->imbe_d + lVar13 + -8);
      fVar23 = 32760.0;
      if ((32760.0 < fVar19) || (fVar23 = -32760.0, fVar19 < -32760.0)) {
        *(float *)(this->imbe_d + lVar13 + -8) = fVar23;
        fVar19 = fVar23;
      }
      *psVar12 = (short)(int)fVar19;
      if (bVar4 == false) {
        psVar12 = psVar12 + 1;
      }
      else {
        psVar12[1] = (short)(int)fVar19;
        psVar12 = psVar12 + 2;
      }
      lVar10 = lVar13 + 4;
    } while ((int)(lVar13 + 4) != 0x368);
    this->m_audio_out_temp_buf_p = (float *)(this->imbe_d + lVar13 + -4);
    this->m_audio_out_buf_p = psVar12;
    this->m_audio_out_nb_samples = iVar9;
    this->m_audio_out_idx = iVar6 + 0xa0;
    this->m_audio_out_idx2 = iVar16 + 0xa0;
  }
  else {
    iVar6 = iVar9 * 0xa0;
    if (this->m_audio_out_buf_size <= this->m_audio_out_nb_samples + iVar6) {
      this->m_audio_out_nb_samples = 0;
      this->m_audio_out_buf_p = this->m_audio_out_buf;
    }
    pfVar17 = this->m_audio_out_float_buf;
    this->m_audio_out_float_buf_p = pfVar17;
    iVar16 = 0xa0;
    do {
      upsample(this,iVar9,*pfVar11);
      pfVar11 = this->m_audio_out_temp_buf_p + 1;
      this->m_audio_out_temp_buf_p = pfVar11;
      this->m_audio_out_float_buf_p = this->m_audio_out_float_buf_p + iVar9;
      uVar2 = this->m_audio_out_idx;
      uVar3 = this->m_audio_out_idx2;
      this->m_audio_out_idx = uVar2 + iVar9;
      this->m_audio_out_idx2 = uVar3 + iVar9;
      iVar16 = iVar16 + -1;
    } while (iVar16 != 0);
    iVar9 = this->m_audio_out_nb_samples;
    bVar4 = this->m_stereo;
    bVar5 = this->m_channels;
    psVar12 = this->m_audio_out_buf_p;
    iVar16 = iVar6;
    do {
      fVar19 = *pfVar17;
      fVar23 = 32760.0;
      if ((32760.0 < fVar19) || (fVar23 = -32760.0, fVar19 < -32760.0)) {
        *pfVar17 = fVar23;
        fVar19 = fVar23;
      }
      sVar14 = (short)(int)fVar19;
      if (bVar4 == false) {
        *psVar12 = sVar14;
        lVar10 = 2;
      }
      else {
        sVar15 = sVar14;
        if ((bVar5 & 1) == 0) {
          sVar15 = 0;
        }
        *psVar12 = sVar15;
        if ((bVar5 & 2) == 0) {
          sVar14 = 0;
        }
        psVar12[1] = sVar14;
        lVar10 = 4;
      }
      psVar12 = (short *)((long)psVar12 + lVar10);
      pfVar17 = pfVar17 + 1;
      iVar16 = iVar16 + -1;
    } while (iVar16 != 0);
    this->m_audio_out_buf_p = psVar12;
    this->m_audio_out_nb_samples = iVar9 + iVar6;
    this->m_audio_out_float_buf_p = pfVar17;
  }
  return;
}

Assistant:

void DSDMBEDecoder::processAudio()
{
    int i, n;
    float aout_abs, max, gainfactor, gaindelta, maxbuf;

    if (m_auto_gain)
    {
        // detect max level
        max = 0;
        m_audio_out_temp_buf_p = m_audio_out_temp_buf;

        for (n = 0; n < 160; n++)
        {
            aout_abs = fabsf(*m_audio_out_temp_buf_p);

            if (aout_abs > max)
            {
                max = aout_abs;
            }

            m_audio_out_temp_buf_p++;
        }

        *m_aout_max_buf_p = max;
        m_aout_max_buf_p++;
        m_aout_max_buf_idx++;

        if (m_aout_max_buf_idx > 24)
        {
            m_aout_max_buf_idx = 0;
            m_aout_max_buf_p = m_aout_max_buf;
        }

        // lookup max history
        for (i = 0; i < 25; i++)
        {
            maxbuf = m_aout_max_buf[i];

            if (maxbuf > max)
            {
                max = maxbuf;
            }
        }

        // determine optimal gain level
        if (max > (float) 0)
        {
            gainfactor = ((float) 30000 / max);
        }
        else
        {
            gainfactor = (float) 50;
        }

        if (gainfactor < m_aout_gain)
        {
            m_aout_gain = gainfactor;
            gaindelta = (float) 0;
        }
        else
        {
            if (gainfactor > (float) 50)
            {
                gainfactor = (float) 50;
            }

            gaindelta = gainfactor - m_aout_gain;

            if (gaindelta > ((float) 0.05 * m_aout_gain))
            {
                gaindelta = ((float) 0.05 * m_aout_gain);
            }
        }

        gaindelta /= (float) 160;

        // adjust output gain
        m_audio_out_temp_buf_p = m_audio_out_temp_buf;

        for (n = 0; n < 160; n++)
        {
            *m_audio_out_temp_buf_p = (m_aout_gain
                    + ((float) n * gaindelta)) * (*m_audio_out_temp_buf_p);
            m_audio_out_temp_buf_p++;
        }

        m_aout_gain += ((float) 160 * gaindelta);
    }
    else
    {
        gaindelta = (float) 0;
    }

    // copy audio data to output buffer and upsample if necessary
    m_audio_out_temp_buf_p = m_audio_out_temp_buf;

    //if ((m_upsample == 6) || (m_upsample == 7)) // upsampling to 48k
    if (m_upsample >= 2)
    {
        int upsampling = m_upsample;

        if (m_audio_out_nb_samples + (160*upsampling) >= m_audio_out_buf_size)
        {
            resetAudio();
        }

        m_audio_out_float_buf_p = m_audio_out_float_buf;

        for (n = 0; n < 160; n++)
        {
            upsample(upsampling, *m_audio_out_temp_buf_p);
            m_audio_out_temp_buf_p++;
            m_audio_out_float_buf_p += upsampling;
            m_audio_out_idx += upsampling;
            m_audio_out_idx2 += upsampling;
        }

        m_audio_out_float_buf_p = m_audio_out_float_buf;

        // copy to output (short) buffer
        for (n = 0; n < (160*upsampling); n++)
        {
            if (*m_audio_out_float_buf_p > (float) 32760)
            {
                *m_audio_out_float_buf_p = (float) 32760;
            }
            else if (*m_audio_out_float_buf_p < (float) -32760)
            {
                *m_audio_out_float_buf_p = (float) -32760;
            }


            if (m_stereo) // produce two channels
            {
            	if (m_channels & 1) { // left channel
                    *m_audio_out_buf_p = (short) *m_audio_out_float_buf_p;
            	} else {
            		*m_audio_out_buf_p = 0;
            	}

                m_audio_out_buf_p++;

                if ((m_channels>>1) & 1) { // right channel
                    *m_audio_out_buf_p = (short) *m_audio_out_float_buf_p;
            	} else {
            		*m_audio_out_buf_p = 0;
            	}

                m_audio_out_buf_p++;
            }
            else // single (mono) channel
            {
                *m_audio_out_buf_p = (short) *m_audio_out_float_buf_p;
                m_audio_out_buf_p++;
            }

            m_audio_out_nb_samples++;
            m_audio_out_float_buf_p++;
        }
    }
    else // leave at 8k
    {
        if (m_audio_out_nb_samples + 160 >= m_audio_out_buf_size)
        {
            resetAudio();
        }

        m_audio_out_float_buf_p = m_audio_out_float_buf;

        for (n = 0; n < 160; n++)
        {
            if (*m_audio_out_temp_buf_p > (float) 32760)
            {
                *m_audio_out_temp_buf_p = (float) 32760;
            }
            else if (*m_audio_out_temp_buf_p < (float) -32760)
            {
                *m_audio_out_temp_buf_p = (float) -32760;
            }

            *m_audio_out_buf_p = (short) *m_audio_out_temp_buf_p;
            m_audio_out_buf_p++;

            if (m_stereo) // produce second channel
            {
                *m_audio_out_buf_p = (short) *m_audio_out_temp_buf_p;
                m_audio_out_buf_p++;
            }

            m_audio_out_nb_samples++;
            m_audio_out_temp_buf_p++;
            m_audio_out_idx++;
            m_audio_out_idx2++;
        }
    }
}